

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O2

bool ON_XMLNodePrivate::RecoverProperty(ON_wString *tag,int equalSign,ON_wString *sProp)

{
  bool bVar1;
  wchar_t wVar2;
  int iVar3;
  wchar_t *tag_name;
  int start_index;
  uint i;
  ulong uVar4;
  ON_wString sValue;
  ON_wString local_60;
  ON_wString sName;
  ON_wString local_50;
  ON_wString local_48;
  ON_wString *local_40;
  ulong local_38;
  
  uVar4 = (ulong)(uint)equalSign;
  local_40 = sProp;
  wVar2 = ON_wString::operator[](tag,equalSign);
  ON_REMOVE_ASAP_AssertEx
            ((uint)(wVar2 == L'='),
             "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_xml.cpp"
             ,0x956,"","tag[equalSign] == L\'=\' is false");
  ON_wString::ON_wString(&sName);
  local_38 = uVar4;
  while (1 < (int)uVar4) {
    i = (int)uVar4 - 1;
    uVar4 = (ulong)i;
    wVar2 = ON_wString::operator[](tag,i);
    if (wVar2 == L' ') break;
    wVar2 = ON_wString::operator[](tag,i);
    ON_wString::ON_wString(&local_60,wVar2,1);
    ON_wString::operator+(&sValue,&local_60);
    ON_wString::operator=(&sName,&sValue);
    ON_wString::~ON_wString(&sValue);
    ON_wString::~ON_wString(&local_60);
  }
  tag_name = ON_wString::operator_cast_to_wchar_t_(&sName);
  bVar1 = IsValidXMLNameWithDebugging(tag_name);
  if (bVar1) {
    bVar1 = ON_wString::IsEmpty(&sName);
    if (!bVar1) {
      iVar3 = ON_wString::Length(tag);
      start_index = (int)local_38 + 2;
      if (start_index < iVar3) {
        wVar2 = ON_wString::operator[](tag,(int)local_38 + 1);
        if (wVar2 == L'\"') {
          iVar3 = ON_wString::Find(tag,L'\"',start_index);
          if (iVar3 != -1) {
            ON_wString::Mid(&sValue,(int)tag,start_index);
            EncodeXML(&sValue);
            ON_wString::operator+(&local_50,(wchar_t *)&sName);
            ON_wString::operator+(&local_48,&local_50);
            ON_wString::operator+(&local_60,(wchar_t *)&local_48);
            ON_wString::operator=(local_40,&local_60);
            ON_wString::~ON_wString(&local_60);
            ON_wString::~ON_wString(&local_48);
            ON_wString::~ON_wString(&local_50);
            ON_wString::~ON_wString(&sValue);
            bVar1 = true;
            goto LAB_0067d31b;
          }
        }
      }
    }
  }
  bVar1 = false;
LAB_0067d31b:
  ON_wString::~ON_wString(&sName);
  return bVar1;
}

Assistant:

bool ON_XMLNodePrivate::RecoverProperty(const ON_wString& tag, int equalSign, ON_wString& sProp) // Static.
{
  // Move left, looking for a space and ensuring every character is a valid name char.
  ON_ASSERT(tag[equalSign] == L'=');

  ON_wString sName;
  int leftScan = equalSign - 1;
  while (leftScan > 0 && tag[leftScan] != L' ')
  {
    sName = ON_wString(tag[leftScan--]) + sName;
  }

  if (!IsValidXMLNameWithDebugging(sName) || sName.IsEmpty())
    return false;

  // Now try to recover the value.
  const int start = equalSign + 2;
  if (start >= tag.Length())
    return false;

  if (tag[equalSign + 1] != L'\"')
    return false;

  const int secondQuote = tag.Find(L'\"', start);
  if (secondQuote == -1)
    return false;

  ON_wString sValue = tag.Mid(start, secondQuote - start);
  EncodeXML(sValue);

  sProp = sName + L"=\"" + sValue + L"\"";

  return true;
}